

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSize __thiscall QDockAreaLayoutInfo::sizeHint(QDockAreaLayoutInfo *this)

{
  QDockAreaLayoutItem *this_00;
  uint uVar1;
  Orientation OVar2;
  Representation RVar3;
  QDockAreaLayoutItem *pQVar4;
  Representation RVar5;
  bool bVar6;
  Representation RVar7;
  QSize QVar8;
  QSize QVar9;
  QSize QVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  Representation RVar16;
  long lVar17;
  Representation RVar18;
  ulong uVar19;
  uint local_74;
  ulong local_70;
  QDockAreaLayoutItem *local_48;
  Representation local_40;
  
  uVar14 = 0;
  uVar19 = 0;
  lVar17 = 0;
  do {
    if ((ulong)(this->item_list).d.size <= uVar19) {
      uVar19 = 0;
      goto LAB_003f514b;
    }
    bVar6 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&((this->item_list).d.ptr)->widgetItem + lVar17));
    lVar17 = lVar17 + 0x28;
    uVar19 = uVar19 + 1;
  } while (bVar6);
  uVar19 = 0;
  uVar14 = 0;
  if (lVar17 != 0) {
    if ((this->item_list).d.size == 0) {
      uVar13 = 0;
      local_74 = 0xffffff;
      uVar15 = 0;
      local_70 = 0;
    }
    else {
      local_74 = 0xffffff;
      lVar17 = 0;
      uVar14 = 0;
      local_48 = (QDockAreaLayoutItem *)0x0;
      local_70 = 0;
      uVar15 = 0;
      uVar13 = 0;
      do {
        pQVar4 = (this->item_list).d.ptr;
        this_00 = (QDockAreaLayoutItem *)((long)&pQVar4->widgetItem + lVar17);
        bVar6 = QDockAreaLayoutItem::skip(this_00);
        RVar16.m_i = uVar15;
        if (!bVar6) {
          uVar1 = *(uint *)((long)&pQVar4->flags + lVar17);
          QVar8 = QDockAreaLayoutItem::sizeHint(this_00);
          OVar2 = this->o;
          QVar9 = QDockAreaLayoutItem::minimumSize(this_00);
          QVar10 = (QSize)((ulong)QVar9 >> 0x20);
          if (OVar2 == Vertical) {
            QVar10 = QVar9;
          }
          RVar16.m_i = QVar10.wd.m_i.m_i;
          if (QVar10.wd.m_i.m_i < (int)uVar13) {
            RVar16.m_i = uVar13;
          }
          uVar13 = RVar16.m_i;
          OVar2 = this->o;
          QVar9 = QDockAreaLayoutItem::maximumSize(this_00);
          QVar10 = (QSize)((ulong)QVar9 >> 0x20);
          if (OVar2 == Vertical) {
            QVar10 = QVar9;
          }
          RVar18.m_i = QVar10.wd.m_i.m_i;
          if ((int)local_74 < QVar10.wd.m_i.m_i) {
            RVar18.m_i = local_74;
          }
          RVar16 = QVar8.ht.m_i;
          RVar3 = QVar8.wd.m_i;
          iVar12 = (int)local_70;
          if (this->tabbed == true) {
            if ((uVar1 & 1) == 0) {
              RVar7.m_i = RVar16.m_i;
              if (this->o == Horizontal) {
                RVar7.m_i = RVar3.m_i;
              }
            }
            else {
              RVar7.m_i = *(uint *)((long)&pQVar4->size + lVar17);
            }
            uVar19 = (ulong)(uint)RVar7.m_i;
            if (RVar7.m_i < iVar12) {
              uVar19 = local_70;
            }
          }
          else {
            if (((local_48 != (QDockAreaLayoutItem *)0x0) && ((uVar1 & 1) == 0)) &&
               ((local_48->flags & 1) == 0)) {
              OVar2 = this->o;
              QVar10 = QDockAreaLayoutItem::minimumSize(local_48);
              QVar8 = QDockAreaLayoutItem::maximumSize(local_48);
              bVar6 = OVar2 == Vertical;
              local_40 = QVar10.wd.m_i;
              RVar7.m_i = QVar10.ht.m_i.m_i;
              if (bVar6) {
                RVar7.m_i = local_40.m_i;
              }
              RVar5 = QVar8.ht.m_i;
              if (bVar6) {
                RVar5 = QVar8.wd.m_i;
              }
              if (RVar7.m_i != RVar5.m_i) {
                iVar12 = iVar12 + *this->sep;
              }
            }
            if ((uVar1 & 1) == 0) {
              RVar7.m_i = RVar16.m_i;
              if (this->o == Horizontal) {
                RVar7.m_i = RVar3.m_i;
              }
            }
            else {
              RVar7.m_i = *(uint *)((long)&pQVar4->size + lVar17);
            }
            uVar19 = (ulong)(uint)(RVar7.m_i + iVar12);
          }
          if (this->o == Vertical) {
            RVar16.m_i = RVar3.m_i;
          }
          local_74 = RVar18.m_i;
          local_70 = uVar19;
          local_48 = this_00;
          if (RVar16.m_i < (int)uVar15) {
            RVar16.m_i = uVar15;
          }
        }
        uVar15 = RVar16.m_i;
        uVar14 = uVar14 + 1;
        lVar17 = lVar17 + 0x28;
      } while (uVar14 < (ulong)(this->item_list).d.size);
    }
    if ((int)local_74 <= (int)uVar13) {
      local_74 = uVar13;
    }
    if ((int)uVar13 < (int)uVar15) {
      uVar13 = uVar15;
    }
    if ((int)local_74 <= (int)uVar13) {
      uVar13 = local_74;
    }
    uVar19 = 0xffffffff;
    if (this->o == Horizontal) {
      uVar19 = local_70;
    }
    if (this->o == Vertical) {
      uVar19 = (ulong)uVar13;
    }
    else {
      local_70 = (ulong)uVar13;
    }
    uVar14 = local_70;
    if (this->tabbed != false) {
      bVar6 = updateTabBar(this);
      if (bVar6) {
        uVar11 = (**(code **)(*(long *)&this->tabBar->super_QWidget + 0x70))();
      }
      else {
        uVar11 = 0;
      }
      if ((uint)this->tabBarShape < 8) {
        iVar12 = (int)(uVar11 >> 0x20);
        if ((0x33U >> (this->tabBarShape & 0x1fU) & 1) == 0) {
          uVar14 = uVar11 >> 0x20;
          if (iVar12 < (int)local_70) {
            uVar14 = local_70;
          }
          uVar19 = (ulong)(uint)((int)uVar19 + (int)uVar11);
        }
        else {
          uVar14 = (ulong)(uint)((int)local_70 + iVar12);
          if ((int)uVar19 <= (int)uVar11) {
            uVar19 = uVar11 & 0xffffffff;
          }
        }
      }
    }
  }
LAB_003f514b:
  return (QSize)(uVar19 | uVar14 << 0x20);
}

Assistant:

QSize QDockAreaLayoutInfo::sizeHint() const
{
    if (isEmpty())
        return QSize(0, 0);

    int a = 0, b = 0;
    int min_perp = 0;
    int max_perp = QWIDGETSIZE_MAX;
    const QDockAreaLayoutItem *previous = nullptr;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        bool gap = item.flags & QDockAreaLayoutItem::GapItem;

        QSize size_hint = item.sizeHint();
        min_perp = qMax(min_perp, perp(o, item.minimumSize()));
        max_perp = qMin(max_perp, perp(o, item.maximumSize()));

#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMax(a, gap ? item.size : pick(o, size_hint));
        } else
#endif
        {
            if (previous && !gap && !(previous->flags &  QDockAreaLayoutItem::GapItem)
                && !previous->hasFixedSize(o)) {
                a += *sep;
            }
            a += gap ? item.size : pick(o, size_hint);
        }
        b = qMax(b, perp(o, size_hint));

        previous = &item;
    }

    max_perp = qMax(max_perp, min_perp);
    b = qMax(b, min_perp);
    b = qMin(b, max_perp);

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        QSize tbh = tabBarSizeHint();
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularNorth:
            case QTabBar::TriangularSouth:
                result.rheight() += tbh.height();
                result.rwidth() = qMax(tbh.width(), result.width());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
            case QTabBar::TriangularEast:
            case QTabBar::TriangularWest:
                result.rheight() = qMax(tbh.height(), result.height());
                result.rwidth() += tbh.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}